

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnlabeledMultiArg.h
# Opt level: O2

bool __thiscall
TCLAP::
UnlabeledMultiArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::operator==(UnlabeledMultiArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *this,Arg *a)

{
  __type _Var1;
  __type _Var2;
  string local_40;
  
  _Var1 = std::operator==(&(this->
                           super_MultiArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ).super_Arg._name,&a->_name);
  _Var2 = true;
  if (!_Var1) {
    Arg::getDescription_abi_cxx11_(&local_40,a);
    _Var2 = std::operator==(&(this->
                             super_MultiArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ).super_Arg._description,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return _Var2;
}

Assistant:

bool UnlabeledMultiArg<T>::operator==(const Arg& a) const
{
	if ( _name == a.getName() || _description == a.getDescription() )
		return true;
	else
		return false;
}